

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::EndSubpass(DeviceContextGLImpl *this)

{
  Uint32 srcX1;
  Uint32 srcY1;
  SubpassDesc *pSVar1;
  FramebufferGLImpl *pFVar2;
  uint uVar3;
  int iVar4;
  GLuint GVar5;
  int iVar6;
  ulong uVar7;
  TextureFormatAttribs *pTVar8;
  undefined4 uVar9;
  char (*in_RCX) [37];
  RenderPassAttachmentDesc *pRVar10;
  int iVar11;
  int iVar12;
  RenderPassGLImpl *pRVar13;
  long lVar14;
  ulong uVar15;
  GLenum err;
  pointer local_88;
  string msg;
  GLint glCurrReadFB;
  undefined4 uStack_54;
  RenderPassGLImpl *local_38;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject ==
      (RenderPassGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pActiveRenderPass",
               (char (*) [20])in_RCX);
    in_RCX = (char (*) [37])0x221;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x221);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pBoundFramebuffer",
               (char (*) [20])in_RCX);
    in_RCX = (char (*) [37])0x222;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x222);
    std::__cxx11::string::~string((string *)&msg);
  }
  pRVar13 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
            m_pObject;
  uVar3 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  if ((pRVar13->super_RenderPassBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount <= uVar3) {
    FormatString<char[26],char[37]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x224);
    std::__cxx11::string::~string((string *)&msg);
    uVar3 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  }
  pSVar1 = (pRVar13->super_RenderPassBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
           .m_Desc.pSubpasses;
  local_88 = (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
              m_pObject)->m_SubpassFramebuffers).
             super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar3;
  glCurrReadFB = 0;
  glGetIntegerv(0x8caa,&glCurrReadFB);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[39],char[17],unsigned_int>
              (false,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c,(char (*) [39])"Failed to get current read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar4 = (local_88->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle;
  if (iVar4 == 0) {
    iVar4 = (**(code **)(*(long *)(this->m_pSwapChain).m_pObject + 0x60))();
  }
  if (glCurrReadFB != iVar4) {
    FormatString<char[28]>(&msg,(char (*) [28])"Unexpected read framebuffer");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22e);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (pSVar1[uVar3].pResolveAttachments != (AttachmentReference *)0x0) {
    GVar5 = (local_88->Resolve).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
            m_uiHandle;
    if (GVar5 == 0) {
      GVar5 = (**(code **)(*(long *)(this->m_pSwapChain).m_pObject + 0x60))();
    }
    (*__glewBindFramebuffer)(0x8ca9,GVar5);
    glCurrReadFB = glGetError();
    if (glCurrReadFB != 0) {
      LogError<false,char[59],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a,(char (*) [59])"Failed to bind resolve destination FBO as draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&glCurrReadFB);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a);
      std::__cxx11::string::~string((string *)&msg);
    }
    pFVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
             m_pObject;
    srcX1 = (pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.Width;
    srcY1 = (pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.Height;
    GLContextState::BlitFramebufferNoScissor
              (&this->m_ContextState,0,0,srcX1,srcY1,0,0,srcX1,srcY1,0x4000,0x2600);
  }
  if (__glewInvalidateFramebuffer == (PFNGLINVALIDATEFRAMEBUFFERPROC)0x0) goto LAB_002f8e3d;
  iVar4 = 0;
  local_38 = pRVar13;
  for (uVar15 = 0; lVar14 = (long)iVar4, uVar15 < pSVar1[uVar3].RenderTargetAttachmentCount;
      uVar15 = uVar15 + 1) {
    uVar7 = (ulong)pSVar1[uVar3].pRenderTargetAttachments[uVar15].AttachmentIndex;
    if (((uVar7 != 0xffffffff) &&
        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
         (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
          m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse
         [uVar7].second)) &&
       ((pRVar13->super_RenderPassBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
        .m_Desc.pAttachments[uVar7].StoreOp == ATTACHMENT_STORE_OP_DISCARD)) {
      if ((local_88->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle == 0) {
        iVar12 = 0x1800;
        if (uVar15 != 0) {
          FormatString<char[58]>
                    ((string *)&glCurrReadFB,
                     (char (*) [58])"Default framebuffer can only have single color attachment");
          DebugAssertionFailed
                    ((Char *)CONCAT44(uStack_54,glCurrReadFB),"EndSubpass",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x256);
          std::__cxx11::string::~string((string *)&glCurrReadFB);
        }
      }
      else {
        iVar12 = (int)uVar15 + 0x8ce0;
      }
      iVar4 = iVar4 + 1;
      *(int *)((long)&msg._M_dataplus._M_p + lVar14 * 4) = iVar12;
      pRVar13 = local_38;
    }
  }
  iVar12 = iVar4;
  if (((pSVar1[uVar3].pDepthStencilAttachment != (AttachmentReference *)0x0) &&
      (uVar15 = (ulong)(pSVar1[uVar3].pDepthStencilAttachment)->AttachmentIndex,
      uVar15 != 0xffffffff)) &&
     ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
      (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject)
      ->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse[uVar15].second)
     ) {
    pRVar10 = (pRVar13->super_RenderPassBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
              .m_Desc.pAttachments;
    if (pRVar10[uVar15].StoreOp == ATTACHMENT_STORE_OP_DISCARD) {
      pRVar10 = pRVar10 + uVar15;
      pTVar8 = GetTextureFormatAttribs(pRVar10->Format);
      if (1 < (byte)(pTVar8->ComponentType - COMPONENT_TYPE_DEPTH)) {
        FormatString<char[26],char[109]>
                  ((string *)&glCurrReadFB,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL"
                   ,(char (*) [109])pRVar10);
        DebugAssertionFailed
                  ((Char *)CONCAT44(uStack_54,glCurrReadFB),"EndSubpass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x26a);
        std::__cxx11::string::~string((string *)&glCurrReadFB);
      }
      if ((local_88->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle == 0) {
        iVar12 = iVar4 + 1;
        *(undefined4 *)((long)&msg._M_dataplus._M_p + lVar14 * 4) = 0x1801;
        if (pTVar8->ComponentType != COMPONENT_TYPE_DEPTH_STENCIL) goto LAB_002f8daa;
        uVar9 = 0x1802;
        iVar11 = 2;
        iVar6 = iVar12;
      }
      else {
        uVar9 = 0x821a;
        if (pTVar8->ComponentType == COMPONENT_TYPE_DEPTH) {
          uVar9 = 0x8d00;
        }
        iVar11 = 1;
        iVar6 = iVar4;
      }
      iVar12 = iVar4 + iVar11;
      *(undefined4 *)((long)&msg._M_dataplus._M_p + (long)iVar6 * 4) = uVar9;
    }
  }
LAB_002f8daa:
  if (0 < iVar12) {
    (*__glewInvalidateFramebuffer)(0x8ca8,iVar12,(GLenum *)&msg);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[33],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x27c,(char (*) [33])"glInvalidateFramebuffer() failed",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>((string *)&glCurrReadFB,(char (*) [6])0x731c01);
      DebugAssertionFailed
                ((Char *)CONCAT44(uStack_54,glCurrReadFB),"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x27c);
      std::__cxx11::string::~string((string *)&glCurrReadFB);
    }
  }
LAB_002f8e3d:
  (this->m_ContextState).m_FBOId = -1;
  return;
}

Assistant:

void DeviceContextGLImpl::EndSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc& SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];

    const FramebufferGLImpl::SubpassFramebuffers& SubpassFBOs = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex);
#ifdef DILIGENT_DEBUG
    {
        GLint glCurrReadFB = 0;
        glGetIntegerv(GL_READ_FRAMEBUFFER_BINDING, &glCurrReadFB);
        DEV_CHECK_GL_ERROR("Failed to get current read framebuffer");
        GLuint glExpectedReadFB = SubpassFBOs.RenderTarget != 0 ? static_cast<GLuint>(SubpassFBOs.RenderTarget) : m_pSwapChain->GetDefaultFBO();
        VERIFY(static_cast<GLuint>(glCurrReadFB) == glExpectedReadFB, "Unexpected read framebuffer");
    }
#endif

    if (SubpassDesc.pResolveAttachments != nullptr)
    {
        GLuint ResolveDstFBO = SubpassFBOs.Resolve;
        if (ResolveDstFBO == 0)
        {
            ResolveDstFBO = m_pSwapChain.RawPtr<ISwapChainGL>()->GetDefaultFBO();
        }
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, ResolveDstFBO);
        DEV_CHECK_GL_ERROR("Failed to bind resolve destination FBO as draw framebuffer");

        const FramebufferDesc& FBODesc = m_pBoundFramebuffer->GetDesc();
        m_ContextState.BlitFramebufferNoScissor(
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            GL_COLOR_BUFFER_BIT,
            GL_NEAREST // Filter is ignored
        );
    }

    if (glInvalidateFramebuffer != nullptr)
    {
        // It is crucially important to invalidate the framebuffer while it is bound
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/mali-performance-2-how-to-correctly-handle-framebuffers
        GLsizei InvalidateAttachmentsCount = 0;

        std::array<GLenum, MAX_RENDER_TARGETS + 1> InvalidateAttachments;
        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const Uint32 RTAttachmentIdx = SubpassDesc.pRenderTargetAttachments[rt].AttachmentIndex;
            if (RTAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[RTAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        VERIFY(rt == 0, "Default framebuffer can only have single color attachment");
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR_ATTACHMENT0 + rt;
                    }
                }
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            const Uint32 DSAttachmentIdx = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
            if (DSAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(DSAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[DSAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[DSAttachmentIdx].Format);
                    VERIFY_EXPR(FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL);
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_DEPTH;
                        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                            InvalidateAttachments[InvalidateAttachmentsCount++] = GL_STENCIL;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ? GL_DEPTH_ATTACHMENT : GL_DEPTH_STENCIL_ATTACHMENT;
                    }
                }
            }
        }

        if (InvalidateAttachmentsCount > 0)
        {
            glInvalidateFramebuffer(GL_READ_FRAMEBUFFER, InvalidateAttachmentsCount, InvalidateAttachments.data());
            DEV_CHECK_GL_ERROR("glInvalidateFramebuffer() failed");
        }
    }

    // TODO: invalidate input attachments using glInvalidateTexImage

    m_ContextState.InvalidateFBO();
}